

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O1

void __thiscall helics::udp::UdpComms::~UdpComms(UdpComms *this)

{
  ~UdpComms(this);
  operator_delete(this,0x4e8);
  return;
}

Assistant:

UdpComms::~UdpComms()
{
    disconnect();
}